

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

void d68000_movem_pd_32(void)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint in_EDI;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char buffer [40];
  
  uVar1 = dasm_read_imm_16(in_EDI);
  buffer[0] = '\0';
  uVar11 = 0;
  do {
    uVar10 = (uint)uVar11;
    if (7 < uVar10) {
      uVar11 = 0;
      do {
        uVar10 = (uint)uVar11;
        if (7 < uVar10) {
          pcVar4 = get_ea_mode_str(g_cpu_ir,2);
          sprintf(g_dasm_str,"movem.l %s, %s",buffer,pcVar4);
          return;
        }
        uVar9 = 7;
        uVar5 = 7 - uVar10;
        uVar8 = uVar10;
        if ((uVar1 >> (uVar5 & 0x1f) & 1) != 0) {
          uVar7 = 0;
          for (uVar8 = 6 - uVar10; uVar8 != 0xffffffff; uVar8 = uVar8 - 1) {
            if ((uVar1 >> (uVar8 & 0x1f) & 1) == 0) {
              uVar9 = uVar10 + uVar7;
              uVar5 = uVar7;
              break;
            }
            uVar7 = uVar7 + 1;
          }
          if (buffer[0] != '\0') {
            sVar3 = strlen(buffer);
            (buffer + sVar3)[0] = '/';
            (buffer + sVar3)[1] = '\0';
          }
          sVar3 = strlen(buffer);
          sprintf(buffer + sVar3,"A%d",uVar11);
          uVar8 = uVar9;
          if (uVar5 != 0) {
            sVar3 = strlen(buffer);
            sprintf(buffer + sVar3,"-A%d",(ulong)(uVar5 + uVar10));
          }
        }
        uVar11 = (ulong)(uVar8 + 1);
      } while( true );
    }
    uVar8 = uVar10;
    if ((uVar1 >> ((byte)(0xf - (char)uVar11) & 0x1f) & 1) != 0) {
      uVar8 = 7;
      iVar2 = 7 - uVar10;
      iVar6 = 0;
      for (uVar5 = 0xe - uVar10; uVar5 != 7; uVar5 = uVar5 - 1) {
        if ((uVar1 >> (uVar5 & 0x1f) & 1) == 0) {
          uVar8 = uVar10 + iVar6;
          iVar2 = iVar6;
          break;
        }
        iVar6 = iVar6 + 1;
      }
      if (buffer[0] != '\0') {
        sVar3 = strlen(buffer);
        (buffer + sVar3)[0] = '/';
        (buffer + sVar3)[1] = '\0';
      }
      sVar3 = strlen(buffer);
      sprintf(buffer + sVar3,"D%d",uVar11);
      if (iVar2 != 0) {
        sVar3 = strlen(buffer);
        sprintf(buffer + sVar3,"-D%d",(ulong)(iVar2 + uVar10));
      }
    }
    uVar11 = (ulong)(uVar8 + 1);
  } while( true );
}

Assistant:

static void d68000_movem_pd_32(void)
{
	uint data = read_imm_16();
	char buffer[40];
	uint first;
	uint run_length;
	uint i;

	buffer[0] = 0;
	for(i=0;i<8;i++)
	{
		if(data&(1<<(15-i)))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(15-(i+1)))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "D%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-D%d", first + run_length);
		}
	}
	for(i=0;i<8;i++)
	{
		if(data&(1<<(7-i)))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(7-(i+1)))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "A%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-A%d", first + run_length);
		}
	}
	sprintf(g_dasm_str, "movem.l %s, %s", buffer, get_ea_mode_str_32(g_cpu_ir));
}